

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

ostream * symbols::operator<<(ostream *out,Object *obj)

{
  long *local_30;
  long local_28;
  long local_20 [2];
  
  (*obj->_vptr_Object[3])(&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream &out, Object const *obj)
    {
        out << obj->toString();
        return out;
    }